

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxhash.c
# Opt level: O1

unsigned_short sxhash_bitvec(OneDArray *obj)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  byte bVar4;
  uint uVar5;
  
  uVar5 = obj->fillpointer;
  uVar2 = obj->offset;
  puVar1 = Lisp_world + (ulong)(*(uint *)obj & 0xfffffff) + (ulong)(uVar2 >> 4);
  if (uVar2 == 0) {
    uVar3 = *puVar1;
  }
  else {
    bVar4 = (byte)uVar2 & 0xf;
    uVar3 = *(short *)((ulong)puVar1 ^ 2) << bVar4 |
            *(ushort *)((ulong)(puVar1 + 1) ^ 2) >> 0x10 - bVar4;
    uVar5 = uVar5 - uVar2;
  }
  if (uVar5 < 0x10) {
    uVar3 = uVar3 >> (0x10U - (char)uVar5 & 0x1f);
  }
  return uVar3;
}

Assistant:

static unsigned short sxhash_bitvec(OneDArray *obj) {
  unsigned short *base;
  unsigned len, offset, bitoffset;
  unsigned short hash = 0;
  len = (unsigned)obj->fillpointer;
  offset = (unsigned)obj->offset;
  base = ((unsigned short *)(NativeAligned2FromLAddr(obj->base))) + (offset >> 4);
  if (offset == 0) {
    hash = (*base);
    if (len < 16) hash = hash >> (16 - len);
  } else {
    bitoffset = offset & 15;
    hash = (GETWORD(base++) << (bitoffset));
    hash |= (GETWORD(base) >> (16 - bitoffset));
    if ((len - offset) < 16) hash = hash >> (16 - (len - offset));
  }
  return (hash);
}